

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  long lVar3;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  allocator<char> local_d9;
  undefined1 local_d8 [8];
  string s;
  string output;
  string input;
  string local_70 [8];
  string key;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string enc_dec;
  char **argv_local;
  int argc_local;
  
  enc_dec.field_2._8_8_ = argv;
  if (argc < 5) {
    usage();
    argv_local._4_4_ = 1;
  }
  else {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_38,pcVar1,&local_39);
    std::allocator<char>::~allocator(&local_39);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,"-e");
    if ((bVar2) &&
       (bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_38,"-d"), bVar2)) {
      usage();
      argv_local._4_4_ = 2;
      key.field_2._8_4_ = 1;
    }
    else {
      pcVar1 = *(char **)(enc_dec.field_2._8_8_ + 0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_70,pcVar1,(allocator<char> *)(input.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(input.field_2._M_local_buf + 0xf));
      lVar3 = std::__cxx11::string::size();
      if (lVar3 == 8) {
        std::__cxx11::string::string((string *)(output.field_2._M_local_buf + 8));
        std::__cxx11::string::string((string *)(s.field_2._M_local_buf + 8));
        if (3 < argc) {
          std::__cxx11::string::operator=
                    ((string *)(output.field_2._M_local_buf + 8),
                     *(char **)(enc_dec.field_2._8_8_ + 0x18));
        }
        if (4 < argc) {
          std::__cxx11::string::operator=
                    ((string *)(s.field_2._M_local_buf + 8),*(char **)(enc_dec.field_2._8_8_ + 0x20)
                    );
        }
        if (5 < argc) {
          pcVar1 = *(char **)(enc_dec.field_2._8_8_ + 0x28);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)local_d8,pcVar1,&local_d9);
          std::allocator<char>::~allocator(&local_d9);
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d8,"-s");
          if (bVar2) {
            s_showMessage = false;
          }
          std::__cxx11::string::~string((string *)local_d8);
        }
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_38,"-e");
        if (bVar2) {
          std::__cxx11::string::string((string *)&local_100,local_70);
          std::__cxx11::string::string
                    ((string *)&local_120,(string *)(output.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)&local_140,(string *)(s.field_2._M_local_buf + 8));
          argv_local._4_4_ = encrypt_decrypt(&local_100,&local_120,&local_140,0);
          std::__cxx11::string::~string((string *)&local_140);
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::~string((string *)&local_100);
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_38,"-d");
          if (bVar2) {
            std::__cxx11::string::string((string *)&local_160,local_70);
            std::__cxx11::string::string
                      ((string *)&local_180,(string *)(output.field_2._M_local_buf + 8));
            std::__cxx11::string::string
                      ((string *)&local_1a0,(string *)(s.field_2._M_local_buf + 8));
            argv_local._4_4_ = encrypt_decrypt(&local_160,&local_180,&local_1a0,1);
            std::__cxx11::string::~string((string *)&local_1a0);
            std::__cxx11::string::~string((string *)&local_180);
            std::__cxx11::string::~string((string *)&local_160);
          }
          else {
            argv_local._4_4_ = 0;
          }
        }
        key.field_2._8_4_ = 1;
        std::__cxx11::string::~string((string *)(s.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(output.field_2._M_local_buf + 8));
      }
      else {
        usage();
        argv_local._4_4_ = 2;
        key.field_2._8_4_ = 1;
      }
      std::__cxx11::string::~string(local_70);
    }
    std::__cxx11::string::~string((string *)local_38);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char **argv)
{

	if (argc < 5)
	{
		usage();
		return 1;
	}

	string enc_dec = argv[1];
	if (enc_dec != "-e" && enc_dec != "-d")
	{
		usage();
		return 2;
	}

	string key = argv[2];
	if (key.size() != 8)
	{
		usage();
		return 2;
	}

	string input, output;
	if (argc > 3)
		input = argv[3];
	if (argc > 4)
		output = argv[4];

	if (argc > 5)
	{
		string s = argv[5];
		if (s == "-s")
			s_showMessage = false;
	}


	assert(sizeof(uint64_t) == 8);

	//    string key = "8654321";
	//    string enc_dec = "-e";
	//    string input = "E:\\MyGitRepo\\myDES\\pgAdmin3.7z";
	//    string output = "E:\\MyGitRepo\\myDES\\pgAdmin3.7z.des";
	//    string enc_dec = "-d";
	//    string input = "E:\\MyGitRepo\\myDES\\pgAdmin3.7z.des";
	//    string output = "E:\\MyGitRepo\\myDES\\pgAdmin3.7z.des.7z";

	if (enc_dec == "-e")
		return encrypt_decrypt(key, input, output, 0);
	if (enc_dec == "-d")
		return encrypt_decrypt(key, input, output, 1);

	return 0;
}